

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalnull.c
# Opt level: O0

int fftnul(fitsfile *fptr,int colnum,LONGLONG nulvalue,int *status)

{
  int iVar1;
  fitsfile *in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  long in_RDI;
  int hdutype;
  tcolumn *colptr;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int *in_stack_ffffffffffffffd0;
  int local_4;
  
  if (in_RCX->HDUposition < 1) {
    iVar1 = ffghdt(in_RCX,in_stack_ffffffffffffffd0,
                   (int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (iVar1 < 1) {
      if (in_stack_ffffffffffffffcc == 2) {
        *(undefined8 *)
         (*(long *)(*(long *)(in_RDI + 8) + 0x3d0) + (long)(in_ESI + -1) * 0xa0 + 0x70) = in_RDX;
        local_4 = in_RCX->HDUposition;
      }
      else {
        in_RCX->HDUposition = 0xe3;
        local_4 = 0xe3;
      }
    }
    else {
      local_4 = in_RCX->HDUposition;
    }
  }
  else {
    local_4 = in_RCX->HDUposition;
  }
  return local_4;
}

Assistant:

int fftnul(fitsfile *fptr,      /* I - FITS file pointer                  */
           int colnum,          /* I - column number to apply nulvalue to */
           LONGLONG nulvalue,   /* I - null pixel value: value of TNULLn  */
           int *status)         /* IO - error status                      */
/*
  Define the value used to represent undefined pixels in the BINTABLE column.
  This only applies to integer datatype columns (TFORM = B, I, or J).
  This routine overrides the null pixel value given by the TNULLn keyword
  if present.  Note that this routine does not write or modify the TNULLn
  keyword, but instead only modifies the value temporarily in the internal
  buffer. Thus, a subsequent call to the ffrdef routine will reset the null
  value back to the TNULLn  keyword value (or not defined if the keyword is not
  present).
*/
{
    tcolumn *colptr;
    int hdutype;

    if (*status > 0)
        return(*status);

    if (ffghdt(fptr, &hdutype, status) > 0)  /* get HDU type */
        return(*status);

    if (hdutype != BINARY_TBL)
        return(*status = NOT_BTABLE);        /* not proper HDU type */
 
    colptr = (fptr->Fptr)->tableptr;   /* set pointer to the first column */
    colptr += (colnum - 1);    /* increment to the correct column */

    colptr->tnull = nulvalue;

    return(*status);
}